

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

int Spl_ManLutMffcSize(Gia_Man_t *p,int iObj,Vec_Int_t *vTemp,Vec_Bit_t *vMarksAnd)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *vLeaves;
  int local_34;
  int local_30;
  int k;
  int i;
  int iTemp;
  Vec_Bit_t *vMarksAnd_local;
  Vec_Int_t *vTemp_local;
  Gia_Man_t *pGStack_10;
  int iObj_local;
  Gia_Man_t *p_local;
  
  local_34 = 0;
  vTemp_local._4_4_ = iObj;
  pGStack_10 = p;
  iVar1 = Gia_ObjIsLut2(p,iObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsLut2(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x1ba,"int Spl_ManLutMffcSize(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *)");
  }
  Gia_ManIncrementTravId(pGStack_10);
  p_00 = pGStack_10;
  vLeaves = Gia_ObjLutFanins2(pGStack_10,vTemp_local._4_4_);
  Gia_ManCollectAnds(p_00,(int *)((long)&vTemp_local + 4),1,vTemp,vLeaves);
  for (local_30 = 0; iVar1 = Vec_IntSize(vTemp), local_30 < iVar1; local_30 = local_30 + 1) {
    iVar1 = Vec_IntEntry(vTemp,local_30);
    iVar2 = Vec_BitEntry(vMarksAnd,iVar1);
    if (iVar2 == 0) {
      Vec_IntWriteEntry(vTemp,local_34,iVar1);
      local_34 = local_34 + 1;
    }
  }
  Vec_IntShrink(vTemp,local_34);
  return local_34;
}

Assistant:

int Spl_ManLutMffcSize( Gia_Man_t * p, int iObj, Vec_Int_t * vTemp, Vec_Bit_t * vMarksAnd )
{
    int iTemp, i, k = 0;
    assert( Gia_ObjIsLut2(p, iObj) );
//Vec_IntPrint( Gia_ObjLutFanins2(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_ManCollectAnds( p, &iObj, 1, vTemp, Gia_ObjLutFanins2(p, iObj) );
    Vec_IntForEachEntry( vTemp, iTemp, i )
        if ( !Vec_BitEntry(vMarksAnd, iTemp) )
            Vec_IntWriteEntry( vTemp, k++, iTemp );
    Vec_IntShrink( vTemp, k );
    return k;
}